

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_unicode_sets.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_27083e::ParseDataSink::put
          (ParseDataSink *this,char *key,ResourceValue *value,UBool param_3,UErrorCode *status)

{
  UErrorCode UVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  undefined7 in_register_00000009;
  int i;
  Key key_00;
  char *key_local;
  int32_t local_e4;
  int32_t local_e0;
  Key local_dc;
  ResourceArray array;
  ResourceTable contextsTable;
  ResourceTable strictnessTable;
  UnicodeString str;
  
  key_local = key;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&contextsTable,value,status,CONCAT71(in_register_00000009,param_3));
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar4 = 0;
    while (UVar2 = icu_63::ResourceTable::getKeyAndValue(&contextsTable,iVar4,&key_local,value),
          UVar2 != '\0') {
      iVar3 = strcmp(key_local,"date");
      if (iVar3 != 0) {
        (*(value->super_UObject)._vptr_UObject[0xb])(&strictnessTable,value,status);
        if (U_ZERO_ERROR < *status) {
          return;
        }
        local_e0 = 0;
        local_e4 = iVar4;
        while (iVar4 = local_e4,
              UVar2 = icu_63::ResourceTable::getKeyAndValue
                                (&strictnessTable,local_e0,&key_local,value), UVar2 != '\0') {
          iVar3 = strcmp(key_local,"lenient");
          (*(value->super_UObject)._vptr_UObject[10])(&array,value,status);
          if (U_ZERO_ERROR < *status) {
            return;
          }
          local_dc = (uint)(iVar3 != 0) * 2 + COMMA;
          i = 0;
          while (i < array.length) {
            icu_63::ResourceArray::getValue(&array,i,value);
            icu_63::ResourceValue::getUnicodeString(&str,value,status);
            if (U_ZERO_ERROR < *status) {
              icu_63::UnicodeString::~UnicodeString(&str);
              return;
            }
            iVar4 = icu_63::UnicodeString::indexOf(&str,L'.');
            key_00 = (uint)(iVar3 != 0) * 2 + PERIOD;
            if ((iVar4 == -1) &&
               (iVar4 = icu_63::UnicodeString::indexOf(&str,L','), key_00 = local_dc, iVar4 == -1))
            {
              iVar4 = icu_63::UnicodeString::indexOf(&str,L'+');
              key_00 = PLUS_SIGN;
              if (iVar4 != -1) goto LAB_0028fab1;
              iVar4 = icu_63::UnicodeString::indexOf(&str,L'‒');
              key_00 = MINUS_SIGN;
              if (iVar4 != -1) goto LAB_0028fab1;
              iVar4 = icu_63::UnicodeString::indexOf(&str,L'$');
              key_00 = DOLLAR_SIGN;
              if (iVar4 != -1) goto LAB_0028fab1;
              iVar4 = icu_63::UnicodeString::indexOf(&str,L'£');
              key_00 = POUND_SIGN;
              if (iVar4 != -1) goto LAB_0028fab1;
              iVar4 = icu_63::UnicodeString::indexOf(&str,L'₨');
              key_00 = RUPEE_SIGN;
              if (iVar4 != -1) goto LAB_0028fab1;
            }
            else {
LAB_0028fab1:
              saveSet(key_00,&str,status);
            }
            UVar1 = *status;
            icu_63::UnicodeString::~UnicodeString(&str);
            i = i + 1;
            if (U_ZERO_ERROR < UVar1) {
              return;
            }
          }
          local_e0 = local_e0 + 1;
        }
      }
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void put(const char* key, ResourceValue& value, UBool /*noFallback*/, UErrorCode& status) U_OVERRIDE {
        ResourceTable contextsTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int i = 0; contextsTable.getKeyAndValue(i, key, value); i++) {
            if (uprv_strcmp(key, "date") == 0) {
                // ignore
            } else {
                ResourceTable strictnessTable = value.getTable(status);
                if (U_FAILURE(status)) { return; }
                for (int j = 0; strictnessTable.getKeyAndValue(j, key, value); j++) {
                    bool isLenient = (uprv_strcmp(key, "lenient") == 0);
                    ResourceArray array = value.getArray(status);
                    if (U_FAILURE(status)) { return; }
                    for (int k = 0; k < array.getSize(); k++) {
                        array.getValue(k, value);
                        UnicodeString str = value.getUnicodeString(status);
                        if (U_FAILURE(status)) { return; }
                        // There is both lenient and strict data for comma/period,
                        // but not for any of the other symbols.
                        if (str.indexOf(u'.') != -1) {
                            saveSet(isLenient ? PERIOD : STRICT_PERIOD, str, status);
                        } else if (str.indexOf(u',') != -1) {
                            saveSet(isLenient ? COMMA : STRICT_COMMA, str, status);
                        } else if (str.indexOf(u'+') != -1) {
                            saveSet(PLUS_SIGN, str, status);
                        } else if (str.indexOf(u'‒') != -1) {
                            saveSet(MINUS_SIGN, str, status);
                        } else if (str.indexOf(u'$') != -1) {
                            saveSet(DOLLAR_SIGN, str, status);
                        } else if (str.indexOf(u'£') != -1) {
                            saveSet(POUND_SIGN, str, status);
                        } else if (str.indexOf(u'₨') != -1) {
                            saveSet(RUPEE_SIGN, str, status);
                        }
                        if (U_FAILURE(status)) { return; }
                    }
                }
            }
        }
    }